

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaPetNet.cpp
# Opt level: O0

int __thiscall NaPetriNet::link(NaPetriNet *this,char *__from,char *__to)

{
  FILE *__stream;
  uint uVar1;
  undefined4 *puVar2;
  NaPetriNode *pNVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  char *pcVar7;
  char *pcVar8;
  NaPetriNode *pNVar9;
  ulong uVar10;
  
  if ((__from == (char *)0x0) || (__to == (char *)0x0)) {
    puVar2 = (undefined4 *)__cxa_allocate_exception(4);
    *puVar2 = 0;
    __cxa_throw(puVar2,&NaException::typeinfo,0);
  }
  if (this->fpDig != (FILE *)0x0) {
    __stream = (FILE *)this->fpDig;
    pNVar3 = NaPetriConnector::host((NaPetriConnector *)__from);
    pcVar4 = NaPetriNode::name(pNVar3);
    pcVar5 = NaPetriConnector::name((NaPetriConnector *)__from);
    pNVar3 = NaPetriConnector::host((NaPetriConnector *)__to);
    pcVar6 = NaPetriNode::name(pNVar3);
    pcVar7 = NaPetriConnector::name((NaPetriConnector *)__to);
    fprintf(__stream,"  %s:%s -> %s:%s ;\n",pcVar4,pcVar5,pcVar6,pcVar7);
  }
  pcVar4 = name(this);
  pNVar3 = NaPetriConnector::host((NaPetriConnector *)__from);
  pcVar5 = NaPetriNode::name(pNVar3);
  pcVar6 = NaPetriConnector::name((NaPetriConnector *)__from);
  pNVar3 = NaPetriConnector::host((NaPetriConnector *)__to);
  pcVar7 = NaPetriNode::name(pNVar3);
  pcVar8 = NaPetriConnector::name((NaPetriConnector *)__to);
  NaPrintLog(" %s: %s.%s -> %s.%s\n",pcVar4,pcVar5,pcVar6,pcVar7,pcVar8);
  pNVar3 = NaPetriConnector::host((NaPetriConnector *)__from);
  pNVar9 = NaPetriConnector::host((NaPetriConnector *)__to);
  if (pNVar3 != pNVar9) {
    pNVar3 = NaPetriConnector::host((NaPetriConnector *)__from);
    (*this->_vptr_NaPetriNet[7])(this,pNVar3);
    pNVar3 = NaPetriConnector::host((NaPetriConnector *)__to);
    (*this->_vptr_NaPetriNet[7])(this,pNVar3);
    uVar10 = (**(code **)(*(long *)__from + 0x58))(__from,__to);
    if (((uVar10 & 1) != 0) &&
       (uVar1 = (**(code **)(*(long *)__to + 0x58))(__to,__from), (uVar1 & 1) != 0)) {
      return uVar1;
    }
    puVar2 = (undefined4 *)__cxa_allocate_exception(4);
    *puVar2 = 0xb;
    __cxa_throw(puVar2,&NaException::typeinfo,0);
  }
  puVar2 = (undefined4 *)__cxa_allocate_exception(4);
  *puVar2 = 0xb;
  __cxa_throw(puVar2,&NaException::typeinfo,0);
}

Assistant:

void
NaPetriNet::link (NaPetriConnector* pcSrc, NaPetriConnector* pcDst)
{
    if(NULL == pcSrc || NULL == pcDst)
        throw(na_null_pointer);

    if(NULL != fpDig) {
	fprintf(fpDig, "  %s:%s -> %s:%s ;\n",
		pcSrc->host()->name(), pcSrc->name(),
		pcDst->host()->name(), pcDst->name());
    }

    NaPrintLog(" %s: %s.%s -> %s.%s\n",
	       name(),
               pcSrc->host()->name(), pcSrc->name(),
               pcDst->host()->name(), pcDst->name());

#if 1
    // Why not?
    if(pcSrc->host() == pcDst->host())
        // Can't link together two connectors of the same host node
        throw(na_not_compatible);
#endif

    add(pcSrc->host());
    add(pcDst->host());

    if(!pcSrc->link(pcDst) || !pcDst->link(pcSrc))
        // Can't link together two connectors of different type
        throw(na_not_compatible);
}